

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm.hpp
# Opt level: O2

void openjij::algorithm::Algorithm<openjij::updater::SwendsenWang>::
     run<openjij::system::ClassicalIsing<openjij::graph::Sparse<double>>,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
               (ClassicalIsing<openjij::graph::Sparse<double>_> *system,
               mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
               *random_number_engine,
               ScheduleList<typename_system::get_system_type<ClassicalIsing<Sparse<double>_>_>::type>
               *schedule_list,
               function<void_(const_openjij::system::ClassicalIsing<openjij::graph::Sparse<double>_>_&,_const_openjij::utility::UpdaterParameter<openjij::system::classical_system>_&)>
               *callback)

{
  pointer pSVar1;
  size_t i;
  ulong uVar2;
  size_t i_1;
  const_iterator __begin0;
  pointer parameter;
  
  parameter = (schedule_list->
              super__Vector_base<openjij::utility::Schedule<openjij::system::classical_system>,_std::allocator<openjij::utility::Schedule<openjij::system::classical_system>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
  pSVar1 = (schedule_list->
           super__Vector_base<openjij::utility::Schedule<openjij::system::classical_system>,_std::allocator<openjij::utility::Schedule<openjij::system::classical_system>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if ((callback->super__Function_base)._M_manager == (_Manager_type)0x0) {
    for (; parameter != pSVar1; parameter = parameter + 1) {
      for (uVar2 = 0; uVar2 < parameter->one_mc_step; uVar2 = uVar2 + 1) {
        updater::SwendsenWang<openjij::system::ClassicalIsing<openjij::graph::Sparse<double>>>::
        update<std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                  (system,random_number_engine,&parameter->updater_parameter);
      }
    }
  }
  else {
    for (; parameter != pSVar1; parameter = parameter + 1) {
      for (uVar2 = 0; uVar2 < parameter->one_mc_step; uVar2 = uVar2 + 1) {
        updater::SwendsenWang<openjij::system::ClassicalIsing<openjij::graph::Sparse<double>>>::
        update<std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                  (system,random_number_engine,&parameter->updater_parameter);
        std::
        function<void_(const_openjij::system::ClassicalIsing<openjij::graph::Sparse<double>_>_&,_const_openjij::utility::UpdaterParameter<openjij::system::classical_system>_&)>
        ::operator()(callback,system,&parameter->updater_parameter);
      }
    }
  }
  return;
}

Assistant:

static void
  run(System &system, RandomNumberEngine &random_number_engine,
      const utility::ScheduleList<
          typename system::get_system_type<System>::type> &schedule_list,
      const std::function<void(
          const System &,
          const utility::UpdaterParameter<
              typename system::get_system_type<System>::type> &)> &callback =
          nullptr) {
    if (callback) {
      // with callback
      for (auto &&schedule : schedule_list) {
        for (std::size_t i = 0; i < schedule.one_mc_step; ++i) {
          Updater<System>::update(system, random_number_engine,
                                  schedule.updater_parameter);
          callback(system, schedule.updater_parameter);
        }
      }
    } else {
      // without callback
      for (auto &&schedule : schedule_list) {
        for (std::size_t i = 0; i < schedule.one_mc_step; ++i) {
          Updater<System>::update(system, random_number_engine,
                                  schedule.updater_parameter);
        }
      }
    }
  }